

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::ShaderSubroutine::NegativeTest12::iterate(NegativeTest12 *this)

{
  ostringstream *this_00;
  NegativeTest12 *pNVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  NotSupportedError *this_01;
  char *pcVar4;
  allocator<char> local_25c;
  allocator<char> local_25b;
  allocator<char> local_25a;
  allocator<char> local_259;
  int local_258;
  uint local_254;
  NegativeTest12 *local_250;
  GLuint *local_248;
  GLuint *local_240;
  Functions *local_238;
  string local_230;
  string vs_body;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [384];
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_238 = (Functions *)CONCAT44(extraout_var,iVar3);
  pcVar4 = "GL_ARB_shader_subroutine";
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (bVar2) {
    local_240 = &this->m_vs_id;
    local_248 = &this->m_po_id;
    iVar3 = 0;
    local_250 = this;
    while (iVar3 != 5) {
      local_1b0._0_4_ = iVar3;
      getVertexShader_abi_cxx11_(&vs_body,(NegativeTest12 *)pcVar4,(_test_case *)local_1b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,glcts::fixed_sample_locations_values + 1,&local_259);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,glcts::fixed_sample_locations_values + 1,&local_25a);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,glcts::fixed_sample_locations_values + 1,&local_25b);
      local_258 = iVar3;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,glcts::fixed_sample_locations_values + 1,&local_25c);
      local_254 = 0;
      pcVar4 = (char *)&vs_body;
      bVar2 = Utils::buildProgram(local_238,(string *)pcVar4,(string *)local_1b0,&local_1f0,
                                  &local_230,&local_1d0,(GLchar **)0x0,&local_254,local_240,
                                  (GLuint *)0x0,(GLuint *)0x0,(GLuint *)0x0,(GLuint *)0x0,local_248)
      ;
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)local_1b0);
      pNVar1 = local_250;
      this_00 = (ostringstream *)(local_1b0 + 8);
      if (bVar2) {
        local_1b0._0_8_ =
             ((local_250->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        pcVar4 = "A program object was successfully built for [";
        std::operator<<((ostream *)this_00,"A program object was successfully built for [");
        local_230._M_dataplus._M_p._0_4_ = local_258;
        getTestCaseString_abi_cxx11_(&local_1f0,(NegativeTest12 *)pcVar4,(_test_case *)&local_230);
        std::operator<<((ostream *)this_00,(string *)&local_1f0);
        std::operator<<((ostream *)this_00,"] test case, even though it was invalid.");
        pcVar4 = &tcu::TestLog::EndMessage;
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        pNVar1->m_has_test_passed = false;
      }
      (*(pNVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[3])(pNVar1);
      std::__cxx11::string::~string((string *)&vs_body);
      iVar3 = local_258 + 1;
    }
    bVar2 = local_250->m_has_test_passed == false;
    if (bVar2) {
      pcVar4 = "Fail";
    }
    else {
      pcVar4 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((local_250->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar2,
               pcVar4);
    return STOP;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,"GL_ARB_shader_subroutine is not supported.",
             (allocator<char> *)&vs_body);
  tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_1b0);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult NegativeTest12::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Iterate over all test cases */
	for (int test_case = static_cast<int>(TEST_CASE_FIRST); test_case != static_cast<int>(TEST_CASE_COUNT); ++test_case)
	{
		/* Try to build a program object using invalid vertex shader, specific to the
		 * iteration we're currently in */
		std::string vs_body = getVertexShader(static_cast<_test_case>(test_case));

		if (ShaderSubroutine::Utils::buildProgram(gl, vs_body, "",   /* tc_body */
												  "",				 /* te_body */
												  "",				 /* gs_body */
												  "",				 /* fs_body */
												  DE_NULL,			 /* xfb_varyings */
												  0,				 /* n_xfb_varyings */
												  &m_vs_id, DE_NULL, /* out_tc_id */
												  DE_NULL,			 /* out_te_id */
												  DE_NULL,			 /* out_gs_id */
												  DE_NULL,			 /* out_fs_id */
												  &m_po_id))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "A program object was successfully built for ["
							   << getTestCaseString(static_cast<_test_case>(test_case))
							   << "] test case, even though it was invalid." << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}

		/* Delete any objects that may have been created */
		deinit();
	} /* for (all test cases) */

	/** All done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}